

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

Nf_Man_t * Nf_StoCreate(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  Vec_Flt_t *p;
  int iVar1;
  Nf_Man_t *p_00;
  abctime aVar2;
  Nf_Obj_t *pNVar3;
  Vec_Int_t *pVVar4;
  word *pEntry;
  Vec_Mem_t *p_01;
  Vec_Wec_t *p_02;
  word Fill;
  int i;
  int iVar5;
  float Entry;
  float Entry_00;
  
  if (0x1e < pPars->nCutNum - 2U) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= NF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x174,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if (4 < pPars->nLutSize - 2U) {
    __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x175,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Vec_IntFreeP(&pGia->vCellMapping);
  if (pGia->pSibls != (int *)0x0) {
    Gia_ManSetPhase(pGia);
  }
  p_00 = (Nf_Man_t *)calloc(1,0x118);
  aVar2 = Abc_Clock();
  p_00->clkStart = aVar2;
  p_00->pGia = pGia;
  p_00->pPars = pPars;
  pNVar3 = (Nf_Obj_t *)calloc((long)pGia->nObjs,0x60);
  p_00->pNfObjs = pNVar3;
  p_00->iCur = 2;
  Vec_PtrGrow(&p_00->vPages,0x100);
  Vec_IntFill(&p_00->vMapRefs,pGia->nObjs * 2,0);
  p = &p_00->vFlowRefs;
  Vec_FltFill(p,pGia->nObjs * 2,Entry);
  Vec_WrdFill(&p_00->vRequired,pGia->nObjs * 2,Fill);
  Vec_IntFill(&p_00->vCutSets,pGia->nObjs,0);
  Vec_FltFill(&p_00->vCutFlows,pGia->nObjs,Entry_00);
  Vec_IntFill(&p_00->vCutDelays,pGia->nObjs,0);
  Vec_IntGrow(&p_00->vBackup,1000);
  pVVar4 = Vec_IntAlloc(0);
  Mf_ManSetFlowRefs(pGia,pVVar4);
  iVar5 = 1;
  for (i = 0; i < pVVar4->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(pVVar4,i);
    Vec_FltWriteEntry(p,iVar5 + -1,(float)iVar1);
    Vec_FltWriteEntry(p,iVar5,(float)iVar1);
    iVar5 = iVar5 + 2;
  }
  free(pVVar4->pArray);
  free(pVVar4);
  pEntry = (word *)malloc(8);
  p_01 = (Vec_Mem_t *)calloc(1,0x30);
  p_01->nEntrySize = 1;
  p_01->LogPageSze = 0xc;
  p_01->PageMask = 0xfff;
  p_01->iPage = -1;
  iVar5 = Abc_PrimeCudd(10000);
  pVVar4 = Vec_IntAlloc(iVar5);
  pVVar4->nSize = iVar5;
  memset(pVVar4->pArray,0xff,(long)iVar5 << 2);
  p_01->vTable = pVVar4;
  pVVar4 = Vec_IntAlloc(10000);
  p_01->vNexts = pVVar4;
  *pEntry = 0;
  iVar5 = Vec_MemHashInsert(p_01,pEntry);
  if (iVar5 != 0) {
    __assert_fail("Value == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                  ,0x189,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  *pEntry = 0xaaaaaaaaaaaaaaaa;
  iVar5 = Vec_MemHashInsert(p_01,pEntry);
  if (iVar5 != 1) {
    __assert_fail("Value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                  ,0x18e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  free(pEntry);
  p_00->vTtMem = p_01;
  p_02 = Vec_WecAlloc((int)pEntry);
  p_00->vTt2Match = p_02;
  Vec_WecPushLevel(p_02);
  Vec_WecPushLevel(p_02);
  if (p_02->nSize == p_01->nEntries) {
    Nf_StoDeriveMatches(p_00,0);
    p_00->InvDelay = p_00->pCells[3].Delays[0];
    p_00->InvArea = p_00->pCells[3].Area;
    *(uint *)p_00->pNfObjs->M[0] = *(uint *)p_00->pNfObjs->M[0] & 0xfff00000;
    *(uint *)p_00->pNfObjs->M[1] = (*(uint *)p_00->pNfObjs->M[1] & 0xfff00000) + 1;
    return p_00;
  }
  __assert_fail("Vec_WecSize(p->vTt2Match) == Vec_MemEntryNum(p->vTtMem)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                ,0x198,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
}

Assistant:

Nf_Man_t * Nf_StoCreate( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    extern void Mf_ManSetFlowRefs( Gia_Man_t * p, Vec_Int_t * vRefs );
    Vec_Int_t * vFlowRefs;
    Nf_Man_t * p;
    int i, Entry;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= NF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vCellMapping );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    // create
    p = ABC_CALLOC( Nf_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pPars    = pPars;
    p->pNfObjs  = ABC_CALLOC( Nf_Obj_t, Gia_ManObjNum(pGia) );
    p->iCur     = 2;
    // other
    Vec_PtrGrow( &p->vPages, 256 );                                    // cut memory
    Vec_IntFill( &p->vMapRefs,  2*Gia_ManObjNum(pGia), 0 );            // mapping refs   (2x)
    Vec_FltFill( &p->vFlowRefs, 2*Gia_ManObjNum(pGia), 0 );            // flow refs      (2x)
    Vec_WrdFill( &p->vRequired, 2*Gia_ManObjNum(pGia), NF_INFINITY );  // required times (2x)
    Vec_IntFill( &p->vCutSets,  Gia_ManObjNum(pGia), 0 );              // cut offsets
    Vec_FltFill( &p->vCutFlows, Gia_ManObjNum(pGia), 0 );              // cut area
    Vec_IntFill( &p->vCutDelays,Gia_ManObjNum(pGia), 0 );              // cut delay
    Vec_IntGrow( &p->vBackup, 1000 );
    // references
    vFlowRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs( pGia, vFlowRefs );
    Vec_IntForEachEntry( vFlowRefs, Entry, i )
    {
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i,   /*0.5* */Entry );
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i+1, /*0.5* */Entry );
    }
    Vec_IntFree(vFlowRefs);
    // matching
    p->vTtMem    = Vec_MemAllocForTT( 6, 0 );          
    p->vTt2Match = Vec_WecAlloc( 1000 ); 
    Vec_WecPushLevel( p->vTt2Match );
    Vec_WecPushLevel( p->vTt2Match );
    assert( Vec_WecSize(p->vTt2Match) == Vec_MemEntryNum(p->vTtMem) );
    Nf_StoDeriveMatches( p, 0 );//pPars->fVerbose );
    p->InvDelay = p->pCells[3].Delays[0];
    p->InvArea  = p->pCells[3].Area;
    Nf_ObjMatchD(p, 0, 0)->Gate = 0;
    Nf_ObjMatchD(p, 0, 1)->Gate = 1;
    // prepare cuts
    return p;
}